

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O2

char * FindMESMessage(char *str)

{
  int iVar1;
  size_t sVar2;
  int len;
  
  sVar2 = strlen(str);
  do {
    len = (int)sVar2;
    iVar1 = AnalyzeMESMessage(str,len);
    if (iVar1 == 0) {
      return str;
    }
    str = str + 1;
    sVar2 = (size_t)(len - 1);
  } while (10 < len);
  return (char *)0x0;
}

Assistant:

inline char* FindMESMessage(char* str)
{
	char* foundstr = str;
	int len = (int)strlen(str);

	while (AnalyzeMESMessage(foundstr, len) != EXIT_SUCCESS)
	{
		foundstr++;
		len--;
		if (len < MESSAGE_LEN_MES) 
		{
			// Could not find the message.
			return NULL;
		}
	}

	return foundstr;
}